

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O1

void Assimp::GetImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out)

{
  pointer *pppBVar1;
  iterator __position;
  FBXImporter *this;
  FBXImporter *local_18;
  
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::reserve(out,0x40);
  this = (FBXImporter *)operator_new(0x88);
  FBXImporter::FBXImporter(this);
  __position._M_current =
       (out->super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (out->super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = this;
    std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
    _M_realloc_insert<Assimp::BaseImporter*>
              ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,__position
               ,(BaseImporter **)&local_18);
  }
  else {
    *__position._M_current = (BaseImporter *)this;
    pppBVar1 = &(out->
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void GetImporterInstanceList(std::vector< BaseImporter* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each worker class here
    // (register_new_importers_here)
    // ----------------------------------------------------------------------------
    out.reserve(64);
#if ( !defined ASSIMP_BUILD_NO_FBX_IMPORTER )
    out.push_back( new FBXImporter() );
#endif
}